

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  ImGuiContextHook *pIVar5;
  _func_void_int_int *p_Var6;
  char *__s1;
  ImGuiWindow **ppIVar7;
  uint *puVar8;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  ImGuiID key;
  ImGuiContext *g_1;
  ImGuiWindow *pIVar13;
  ImGuiViewport *pIVar14;
  ImGuiWindow **ppIVar15;
  ulong uVar16;
  uint *__dest;
  byte bVar17;
  uint uVar18;
  ImGuiContext *g_3;
  char *pcVar19;
  char *label;
  ImGuiContext *g;
  ImGuiContext *g_2;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  ImRect local_48;
  
  pIVar11 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x111f,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    if (GImGui->WithinFrameScope == false) {
      __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x1124,"void ImGui::EndFrame()");
    }
    if (0 < (GImGui->Hooks).Size) {
      lVar21 = 0;
      lVar22 = 0;
      do {
        pIVar5 = (pIVar11->Hooks).Data;
        if (*(int *)(pIVar5 + lVar21 + 4) == 2) {
          (**(code **)(pIVar5 + lVar21 + 0x10))(pIVar11,pIVar5 + lVar21);
        }
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x20;
      } while (lVar22 < (pIVar11->Hooks).Size);
    }
    bVar4 = (GImGui->IO).KeyCtrl;
    uVar18 = bVar4 + 2;
    if ((GImGui->IO).KeyShift == false) {
      uVar18 = (uint)bVar4;
    }
    uVar24 = uVar18 + 4;
    if ((GImGui->IO).KeyAlt == false) {
      uVar24 = uVar18;
    }
    uVar18 = uVar24 + 8;
    if ((GImGui->IO).KeySuper == false) {
      uVar18 = uVar24;
    }
    if ((uVar18 != 0) && ((GImGui->IO).KeyMods != uVar18)) {
      __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x1c0c,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    iVar20 = (GImGui->CurrentWindowStack).Size;
    if (iVar20 != 1) {
      if (iVar20 < 2) {
        __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                      ,0x1c1e,"void ImGui::ErrorCheckEndFrameSanityChecks()");
      }
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x1c18,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    if ((GImGui->GroupStack).Size != 0) {
      __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x1c22,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    p_Var6 = (pIVar11->IO).ImeSetInputScreenPosFn;
    if (p_Var6 != (_func_void_int_int *)0x0) {
      fVar25 = (pIVar11->PlatformImeLastPos).x;
      if (((fVar25 == 3.4028235e+38) && (!NAN(fVar25))) ||
         (fVar25 = fVar25 - (pIVar11->PlatformImePos).x,
         fVar26 = (pIVar11->PlatformImeLastPos).y - (pIVar11->PlatformImePos).y,
         0.0001 < fVar25 * fVar25 + fVar26 * fVar26)) {
        (*p_Var6)((int)(pIVar11->PlatformImePos).x,(int)(pIVar11->PlatformImePos).y);
        pIVar11->PlatformImeLastPos = pIVar11->PlatformImePos;
      }
    }
    pIVar11->WithinFrameScopeWithImplicitWindow = false;
    pIVar13 = pIVar11->CurrentWindow;
    if ((pIVar13 != (ImGuiWindow *)0x0) && (pIVar13->WriteAccessed == false)) {
      pIVar13->Active = false;
    }
    End();
    pIVar12 = GImGui;
    if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
      if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
        key = ImHashStr("###NavWindowingList",0,0);
        pIVar13 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar12->WindowsById,key);
        pIVar12->NavWindowingListWindow = pIVar13;
      }
      pIVar14 = GetMainViewport();
      pIVar10 = GImGui;
      fVar25 = (pIVar14->Size).x;
      fVar26 = (pIVar14->Size).y;
      uVar18 = (GImGui->NextWindowData).Flags;
      (GImGui->NextWindowData).Flags = uVar18 | 0x10;
      (pIVar10->NextWindowData).SizeConstraintRect.Min.x = fVar25 * 0.2;
      (pIVar10->NextWindowData).SizeConstraintRect.Min.y = fVar26 * 0.2;
      (pIVar10->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar10->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar10->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar10->NextWindowData).SizeCallbackUserData = (void *)0x0;
      fVar25 = (pIVar14->Size).x;
      fVar26 = (pIVar14->Pos).x;
      fVar2 = (pIVar14->Size).y;
      fVar3 = (pIVar14->Pos).y;
      (pIVar10->NextWindowData).Flags = uVar18 | 0x11;
      IVar9.y = fVar2 * 0.5 + fVar3;
      IVar9.x = fVar25 * 0.5 + fVar26;
      (pIVar10->NextWindowData).PosVal = IVar9;
      (pIVar10->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar10->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar10->NextWindowData).PosCond = 1;
      fVar25 = (pIVar12->Style).WindowPadding.x;
      fVar26 = (pIVar12->Style).WindowPadding.y;
      local_48.Min.y = fVar26 + fVar26;
      local_48.Min.x = fVar25 + fVar25;
      PushStyleVar(1,&local_48.Min);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      lVar21 = (long)(pIVar12->WindowsFocusOrder).Size;
      if (0 < lVar21) {
        do {
          if ((pIVar12->WindowsFocusOrder).Size < lVar21) goto LAB_001f2b91;
          pIVar13 = (pIVar12->WindowsFocusOrder).Data[lVar21 + -1];
          if (pIVar13 == (ImGuiWindow *)0x0) {
            __assert_fail("window != __null",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                          ,0x2609,"void ImGui::NavUpdateWindowingOverlay()");
          }
          if (((pIVar13->WasActive == true) && (pIVar13->RootWindow == pIVar13)) &&
             (uVar18 = pIVar13->Flags, (uVar18 >> 0x13 & 1) == 0)) {
            __s1 = pIVar13->Name;
            pcVar19 = __s1;
            if (__s1 != (char *)0xffffffffffffffff) {
              do {
                if (*pcVar19 == '#') {
                  if (pcVar19[1] == '#') goto LAB_001f24af;
                }
                else if (*pcVar19 == '\0') goto LAB_001f24af;
                pcVar19 = pcVar19 + 1;
              } while (pcVar19 != (char *)0xffffffffffffffff);
              pcVar19 = (char *)0xffffffffffffffff;
            }
LAB_001f24af:
            label = __s1;
            if ((__s1 == pcVar19) && (label = "(Popup)", (uVar18 >> 0x1a & 1) == 0)) {
              if ((uVar18 >> 10 & 1) != 0) {
                iVar20 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar20 == 0) goto LAB_001f24ea;
              }
              label = "(Untitled)";
            }
LAB_001f24ea:
            local_48.Min.x = 0.0;
            local_48.Min.y = 0.0;
            Selectable(label,pIVar12->NavWindowingTarget == pIVar13,0,&local_48.Min);
          }
          bVar4 = 1 < lVar21;
          lVar21 = lVar21 + -1;
        } while (bVar4);
      }
      End();
      PopStyleVar(1);
    }
    pIVar13 = pIVar12->NavWrapRequestWindow;
    if (((pIVar13 != (ImGuiWindow *)0x0) && (pIVar12->NavWindow == pIVar13)) &&
       ((GImGui->NavMoveRequest == true &&
        (((((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)) &&
          (pIVar12->NavMoveRequestForward == ImGuiNavForward_None)) &&
         (pIVar12->NavLayer == ImGuiNavLayer_Main)))))) {
      uVar18 = pIVar12->NavWrapRequestFlags;
      if (uVar18 == 0) {
        __assert_fail("move_flags != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                      ,0x2500,"void ImGui::NavEndFrame()");
      }
      local_48.Min = pIVar13->NavRectRel[0].Min;
      local_48.Max = pIVar13->NavRectRel[0].Max;
      iVar20 = pIVar12->NavMoveDir;
      if (iVar20 == 0) {
        if ((uVar18 & 5) == 0) {
          iVar20 = 0;
        }
        else {
          fVar25 = (pIVar13->SizeFull).x;
          fVar26 = (pIVar13->WindowPadding).x;
          fVar26 = fVar26 + fVar26 + (pIVar13->ContentSize).x;
          uVar24 = -(uint)(fVar26 <= fVar25);
          fVar25 = (float)(uVar24 & (uint)fVar25 | ~uVar24 & (uint)fVar26) - (pIVar13->Scroll).x;
          iVar20 = 0;
          if ((uVar18 & 4) != 0) {
            fVar26 = local_48.Max.y - local_48.Min.y;
            local_48.Min.y = local_48.Min.y - fVar26;
            local_48.Max.y = local_48.Max.y - fVar26;
            iVar20 = 2;
          }
          local_48.Max.x = fVar25;
          local_48.Min.x = fVar25;
          NavMoveRequestForward(0,iVar20,&local_48,uVar18);
        }
      }
      if ((uVar18 & 5) != 0 && pIVar12->NavMoveDir == 1) {
        fVar25 = (pIVar13->Scroll).x;
        fVar2 = local_48.Max.y;
        local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar25) ^ 0x80000000);
        fVar26 = local_48.Min.y;
        local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar25) ^ 0x80000000);
        if ((uVar18 & 4) != 0) {
          fVar25 = fVar2 - fVar26;
          local_48.Min.y = fVar26 + fVar25;
          local_48.Max.y = fVar25 + fVar2;
          iVar20 = 3;
        }
        NavMoveRequestForward(pIVar12->NavMoveDir,iVar20,&local_48,uVar18);
      }
      if ((uVar18 & 10) != 0 && pIVar12->NavMoveDir == 2) {
        fVar25 = (pIVar13->SizeFull).y;
        fVar26 = (pIVar13->WindowPadding).y;
        fVar26 = fVar26 + fVar26 + (pIVar13->ContentSize).y;
        uVar24 = -(uint)(fVar26 <= fVar25);
        fVar25 = (float)(uVar24 & (uint)fVar25 | ~uVar24 & (uint)fVar26) - (pIVar13->Scroll).y;
        if ((uVar18 & 8) != 0) {
          fVar26 = local_48.Max.x - local_48.Min.x;
          local_48.Min.x = local_48.Min.x - fVar26;
          local_48.Max.x = local_48.Max.x - fVar26;
          iVar20 = 0;
        }
        local_48.Max.y = fVar25;
        local_48.Min.y = fVar25;
        NavMoveRequestForward(pIVar12->NavMoveDir,iVar20,&local_48,uVar18);
      }
      if (pIVar12->NavMoveDir == 3 && (uVar18 & 10) != 0) {
        fVar25 = (pIVar13->Scroll).y;
        fVar2 = local_48.Max.x;
        local_48.Max = (ImVec2)(CONCAT44(fVar25,local_48.Max.x) ^ 0x8000000000000000);
        fVar26 = local_48.Min.x;
        local_48.Min = (ImVec2)(CONCAT44(fVar25,local_48.Min.x) ^ 0x8000000000000000);
        if ((uVar18 & 8) != 0) {
          fVar25 = fVar2 - fVar26;
          local_48.Min.x = fVar26 + fVar25;
          local_48.Max.x = fVar25 + fVar2;
          iVar20 = 1;
        }
        NavMoveRequestForward(pIVar12->NavMoveDir,iVar20,&local_48,uVar18);
      }
    }
    if (pIVar11->DragDropActive == true) {
      if ((pIVar11->DragDropPayload).DataFrameCount + 1 < pIVar11->FrameCount) {
        bVar17 = 1;
        if ((pIVar11->DragDropSourceFlags & 0x20) == 0) {
          if (4 < (ulong)(uint)pIVar11->DragDropMouseButton) {
            __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                          ,0x1258,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
          }
          bVar17 = (GImGui->IO).MouseDown[(uint)pIVar11->DragDropMouseButton] ^ 1;
        }
      }
      else {
        bVar17 = 0;
      }
      if ((bVar17 != 0) || ((pIVar11->DragDropPayload).Delivery != false)) {
        ClearDragDrop();
      }
    }
    if (((pIVar11->DragDropActive == true) &&
        (pIVar11->DragDropSourceFrameCount < pIVar11->FrameCount)) &&
       ((pIVar11->DragDropSourceFlags & 1) == 0)) {
      pIVar11->DragDropWithinSource = true;
      SetTooltip("...");
      pIVar11->DragDropWithinSource = false;
    }
    pIVar11->WithinFrameScope = false;
    pIVar11->FrameCountEnded = pIVar11->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    iVar20 = (pIVar11->WindowsTempSortBuffer).Capacity;
    if (iVar20 < 0) {
      uVar18 = iVar20 / 2 + iVar20;
      uVar16 = 0;
      if (0 < (int)uVar18) {
        uVar16 = (ulong)uVar18;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar15 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar16 * 8,GImAllocatorUserData);
      ppIVar7 = (pIVar11->WindowsTempSortBuffer).Data;
      if (ppIVar7 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar15,ppIVar7,(long)(pIVar11->WindowsTempSortBuffer).Size << 3);
        ppIVar7 = (pIVar11->WindowsTempSortBuffer).Data;
        if ((ppIVar7 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar7,GImAllocatorUserData);
      }
      (pIVar11->WindowsTempSortBuffer).Data = ppIVar15;
      (pIVar11->WindowsTempSortBuffer).Capacity = (int)uVar16;
    }
    (pIVar11->WindowsTempSortBuffer).Size = 0;
    iVar20 = (pIVar11->Windows).Size;
    if ((pIVar11->WindowsTempSortBuffer).Capacity < iVar20) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar15 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar20 << 3,GImAllocatorUserData);
      ppIVar7 = (pIVar11->WindowsTempSortBuffer).Data;
      if (ppIVar7 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar15,ppIVar7,(long)(pIVar11->WindowsTempSortBuffer).Size << 3);
        ppIVar7 = (pIVar11->WindowsTempSortBuffer).Data;
        if ((ppIVar7 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar7,GImAllocatorUserData);
      }
      (pIVar11->WindowsTempSortBuffer).Data = ppIVar15;
      (pIVar11->WindowsTempSortBuffer).Capacity = iVar20;
    }
    uVar18 = (pIVar11->Windows).Size;
    uVar16 = (ulong)uVar18;
    if (uVar18 != 0) {
      uVar23 = 0;
      do {
        if ((long)(int)uVar16 <= (long)uVar23) {
LAB_001f2b91:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                        ,0x68b,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        pIVar13 = (pIVar11->Windows).Data[uVar23];
        if ((pIVar13->Active != true) || ((pIVar13->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(&pIVar11->WindowsTempSortBuffer,pIVar13);
        }
        uVar23 = uVar23 + 1;
        uVar18 = (pIVar11->Windows).Size;
        uVar16 = (ulong)uVar18;
      } while (uVar23 != uVar16);
    }
    uVar24 = (pIVar11->WindowsTempSortBuffer).Size;
    if (uVar18 != uVar24) {
      __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x115f,"void ImGui::EndFrame()");
    }
    (pIVar11->WindowsTempSortBuffer).Size = uVar18;
    (pIVar11->Windows).Size = uVar24;
    iVar20 = (pIVar11->WindowsTempSortBuffer).Capacity;
    (pIVar11->WindowsTempSortBuffer).Capacity = (pIVar11->Windows).Capacity;
    (pIVar11->Windows).Capacity = iVar20;
    ppIVar7 = (pIVar11->WindowsTempSortBuffer).Data;
    (pIVar11->WindowsTempSortBuffer).Data = (pIVar11->Windows).Data;
    (pIVar11->Windows).Data = ppIVar7;
    (pIVar11->IO).MetricsActiveWindows = pIVar11->WindowsActiveCount;
    ((pIVar11->IO).Fonts)->Locked = false;
    (pIVar11->IO).MouseWheel = 0.0;
    (pIVar11->IO).MouseWheelH = 0.0;
    iVar20 = (pIVar11->IO).InputQueueCharacters.Capacity;
    if (iVar20 < 0) {
      uVar18 = iVar20 / 2 + iVar20;
      uVar16 = 0;
      if (0 < (int)uVar18) {
        uVar16 = (ulong)uVar18;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)(uVar16 * 4,GImAllocatorUserData);
      puVar8 = (pIVar11->IO).InputQueueCharacters.Data;
      if (puVar8 != (uint *)0x0) {
        memcpy(__dest,puVar8,(long)(pIVar11->IO).InputQueueCharacters.Size << 2);
        puVar8 = (pIVar11->IO).InputQueueCharacters.Data;
        if ((puVar8 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar8,GImAllocatorUserData);
      }
      (pIVar11->IO).InputQueueCharacters.Data = __dest;
      (pIVar11->IO).InputQueueCharacters.Capacity = (int)uVar16;
    }
    (pIVar11->IO).InputQueueCharacters.Size = 0;
    (pIVar11->IO).NavInputs[0] = 0.0;
    (pIVar11->IO).NavInputs[1] = 0.0;
    (pIVar11->IO).NavInputs[2] = 0.0;
    (pIVar11->IO).NavInputs[3] = 0.0;
    (pIVar11->IO).NavInputs[4] = 0.0;
    (pIVar11->IO).NavInputs[5] = 0.0;
    (pIVar11->IO).NavInputs[6] = 0.0;
    (pIVar11->IO).NavInputs[7] = 0.0;
    (pIVar11->IO).NavInputs[8] = 0.0;
    (pIVar11->IO).NavInputs[9] = 0.0;
    (pIVar11->IO).NavInputs[10] = 0.0;
    (pIVar11->IO).NavInputs[0xb] = 0.0;
    (pIVar11->IO).NavInputs[0xc] = 0.0;
    (pIVar11->IO).NavInputs[0xd] = 0.0;
    (pIVar11->IO).NavInputs[0xe] = 0.0;
    (pIVar11->IO).NavInputs[0xf] = 0.0;
    (pIVar11->IO).NavInputs[0x10] = 0.0;
    (pIVar11->IO).NavInputs[0x11] = 0.0;
    (pIVar11->IO).NavInputs[0x12] = 0.0;
    (pIVar11->IO).NavInputs[0x13] = 0.0;
    (pIVar11->IO).NavInputs[0x14] = 0.0;
    if (0 < (pIVar11->Hooks).Size) {
      lVar21 = 0;
      lVar22 = 0;
      do {
        pIVar5 = (pIVar11->Hooks).Data;
        if (*(int *)(pIVar5 + lVar21 + 4) == 3) {
          (**(code **)(pIVar5 + lVar21 + 0x10))(pIVar11,pIVar5 + lVar21);
        }
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x20;
      } while (lVar22 < (pIVar11->Hooks).Size);
    }
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}